

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

void tlx::die_with_message(char *msg,char *file,size_t line)

{
  ostream *poVar1;
  undefined8 extraout_RAX;
  string sStack_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,msg);
  poVar1 = std::operator<<(poVar1," @ ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  die_with_message(&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void die_with_message(const char* msg, const char* file, size_t line) {
    std::ostringstream oss;
    oss << msg << " @ " << file << ':' << line;
    die_with_message(oss.str());
}